

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O0

string * get_index_type_name_abi_cxx11_(IndexType type)

{
  runtime_error *this;
  char *__s;
  int in_ESI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  allocator<char> local_d [13];
  
  __s = (char *)(ulong)(in_ESI - 1);
  switch(__s) {
  case (char *)0x0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,__s,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(local_d);
    break;
  case (char *)0x1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,__s,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe3);
    break;
  case (char *)0x2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,__s,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe2);
    break;
  case (char *)0x3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,__s,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe1);
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"unhandled index type");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return in_RDI;
}

Assistant:

std::string get_index_type_name(IndexType type) {
    switch (type) {
        case IndexType::GRAM3:
            return "gram3";
        case IndexType::TEXT4:
            return "text4";
        case IndexType::HASH4:
            return "hash4";
        case IndexType::WIDE8:
            return "wide8";
    }

    throw std::runtime_error("unhandled index type");
}